

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

void paramlabel(int tabindex,char *label,int *bytecount)

{
  uint uVar1;
  size_t sVar2;
  char indexstr [5];
  char local_25 [5];
  
  builtin_strncpy(label,"[bp",4);
  uVar1 = *bytecount;
  if (0 < (int)uVar1) {
    sVar2 = strlen(label);
    (label + sVar2)[0] = '+';
    (label + sVar2)[1] = '\0';
    uVar1 = *bytecount;
  }
  sprintf(local_25,"%d",(ulong)uVar1);
  strcat(label,local_25);
  *bytecount = *bytecount + ((uint)(symtab[tabindex].dataclass == dtinteger) * 2 | 0xfffffffc);
  sVar2 = strlen(label);
  (label + sVar2)[0] = ']';
  (label + sVar2)[1] = '\0';
  strcpy(symtab[tabindex].label,label);
  return;
}

Assistant:

void	paramlabel(int tabindex, char *label, int *bytecount)
{
    char indexstr[5];
    if (*bytecount < 0)	{
        if (data_class(tabindex) == dtinteger)
            strcpy(label, "[bp");
        else
            strcpy(label, "[bp");
    }
    else
        strcpy(label, "[bp");
    if (*bytecount > 0)
        strcat(label, "+");
    //itoa(*bytecount, indexstr, 10);
    sprintf(indexstr, "%d", *bytecount);
    strcat(label, indexstr);
    *bytecount -= data_class(tabindex) == dtinteger? 2: 4;
    strcat(label, "]");
    strcpy(symtab[tabindex].label, label);
}